

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<14,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_3,_2> *mat;
  Type in0;
  Mat2x3 local_8c;
  MatrixCaseUtils local_74 [12];
  MatrixCaseUtils local_68 [12];
  tcu local_5c [12];
  VecAccess<float,_4,_3> local_50;
  Matrix<float,_3,_2> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,6>(&local_8c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&local_8c,(float *)s_constInMat2x3);
  }
  reduceToVec3(local_68,&local_8c);
  decrement<float,3,2>(&local_38,(MatrixCaseUtils *)&local_8c,mat);
  reduceToVec3(local_74,&local_38);
  tcu::operator+(local_5c,(Vector<float,_3> *)local_68,(Vector<float,_3> *)local_74);
  local_50.m_vector = &evalCtx->color;
  local_50.m_index[0] = 0;
  local_50.m_index[1] = 1;
  local_50.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,(Vector<float,_3> *)local_5c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}